

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

token * __thiscall libchars::commands::find_flag(commands *this,char *name)

{
  int iVar1;
  token *ptVar2;
  
  ptVar2 = (token *)0x0;
  if ((name != (char *)0x0) && (this->cmd != (command *)0x0)) {
    for (ptVar2 = this->t_par;
        (ptVar2 != (token *)0x0 &&
        ((iVar1 = std::__cxx11::string::compare((char *)&ptVar2->name), iVar1 != 0 ||
         (ptVar2->ttype != FLAG)))); ptVar2 = ptVar2->next) {
    }
  }
  return ptVar2;
}

Assistant:

token *commands::find_flag(const char *name)
    {
        if (name == NULL)
            return NULL;
        if (cmd == NULL)
            return NULL;

        token *T = t_par;
        while (T != NULL && (T->name != name || T->ttype != token::FLAG))
            T = T->next;

        return T;
    }